

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile(cmLocalUnixMakefileGenerator3 *this)

{
  cmOutputConverter *this_00;
  string *psVar1;
  ostream *poVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string infoFileName;
  cmGeneratedFileStream infoFileStream;
  string local_2a0;
  undefined1 local_280 [16];
  undefined8 local_270;
  char *local_268;
  byte abStack_260 [584];
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  local_280._8_8_ = (psVar1->_M_dataplus)._M_p;
  local_280._0_8_ = psVar1->_M_string_length;
  local_270 = 0x2b;
  local_268 = "/CMakeFiles/CMakeDirectoryInformation.cmake";
  views._M_len = 2;
  views._M_array = (iterator)local_280;
  cmCatViews_abi_cxx11_(&local_2a0,views);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_280,&local_2a0,false,None);
  if ((abStack_260[(long)*(_func_int **)(local_280._0_8_ + -0x18)] & 5) == 0) {
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_280,true);
    WriteDisclaimer(this,(ostream *)local_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,"# Relative path conversion top directories.\n",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,"set(CMAKE_RELATIVE_PATH_TOP_SOURCE \"",0x24);
    this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
    psVar1 = cmOutputConverter::GetRelativePathTopSource_abi_cxx11_(this_00);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_280,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\")\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"set(CMAKE_RELATIVE_PATH_TOP_BINARY \"",0x24);
    psVar1 = cmOutputConverter::GetRelativePathTopBinary_abi_cxx11_(this_00);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\")\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if (cmSystemTools::s_ForceUnixPaths == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_280,"# Force unix paths in dependencies.\n",0x24);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_280,"set(CMAKE_FORCE_UNIX_PATHS 1)\n",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,"# The C and CXX include file regular expressions for ",0x35);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,"this directory.\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,"set(CMAKE_C_INCLUDE_REGEX_SCAN ",0x1f);
    psVar1 = cmMakefile::GetIncludeRegularExpression_abi_cxx11_
                       ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile);
    WriteCMakeArgument((ostream *)local_280,psVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,"set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ",0x23);
    WriteCMakeArgument((ostream *)local_280,
                       &((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile)->
                        ComplainFileRegularExpression);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,
               "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,
               "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN ${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n",0x48);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile()
{
  std::string infoFileName =
    cmStrCat(this->GetCurrentBinaryDirectory(),
             "/CMakeFiles/CMakeDirectoryInformation.cmake");

  // Open the output file.
  cmGeneratedFileStream infoFileStream(infoFileName);
  if (!infoFileStream) {
    return;
  }

  infoFileStream.SetCopyIfDifferent(true);
  // Write the do not edit header.
  this->WriteDisclaimer(infoFileStream);

  // Setup relative path conversion tops.
  /* clang-format off */
  infoFileStream
    << "# Relative path conversion top directories.\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_SOURCE \""
    << this->GetRelativePathTopSource() << "\")\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_BINARY \""
    << this->GetRelativePathTopBinary() << "\")\n"
    << "\n";
  /* clang-format on */

  // Tell the dependency scanner to use unix paths if necessary.
  if (cmSystemTools::GetForceUnixPaths()) {
    /* clang-format off */
    infoFileStream
      << "# Force unix paths in dependencies.\n"
      << "set(CMAKE_FORCE_UNIX_PATHS 1)\n"
      << "\n";
    /* clang-format on */
  }

  // Store the include regular expressions for this directory.
  infoFileStream << "\n"
                 << "# The C and CXX include file regular expressions for "
                 << "this directory.\n";
  infoFileStream << "set(CMAKE_C_INCLUDE_REGEX_SCAN ";
  cmLocalUnixMakefileGenerator3::WriteCMakeArgument(
    infoFileStream, this->Makefile->GetIncludeRegularExpression());
  infoFileStream << ")\n";
  infoFileStream << "set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ";
  cmLocalUnixMakefileGenerator3::WriteCMakeArgument(
    infoFileStream, this->Makefile->GetComplainRegularExpression());
  infoFileStream << ")\n";
  infoFileStream
    << "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n";
  infoFileStream << "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN "
                    "${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n";
}